

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  undefined4 uVar7;
  uint uVar8;
  int y;
  int iVar9;
  byte *__s;
  int iVar10;
  int iVar12;
  int iVar13;
  undefined1 auVar11 [16];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  if (this->_data != (uchar *)0x0) {
    uVar8 = this->_width;
    uVar1 = this->_height;
    uVar2 = this->_depth;
    uVar14 = this->_spectrum;
    auVar11._0_4_ = -(uint)(uVar8 == 0);
    auVar11._4_4_ = -(uint)(uVar1 == 0);
    auVar11._8_4_ = -(uint)(uVar2 == 0);
    auVar11._12_4_ = -(uint)(uVar14 == 0);
    uVar7 = movmskps((int)this,auVar11);
    if ((char)uVar7 == '\0') {
      uVar15 = -(uint)(x0 < x1);
      uVar16 = -(uint)(y0 < y1);
      uVar17 = -(uint)(z0 < z1);
      uVar18 = -(uint)(c0 < c1);
      uVar20 = x0 & uVar15 | ~uVar15 & x1;
      uVar21 = y0 & uVar16 | ~uVar16 & y1;
      uVar22 = z0 & uVar17 | ~uVar17 & z1;
      uVar23 = c0 & uVar18 | ~uVar18 & c1;
      uVar15 = ~uVar15 & x0 | x1 & uVar15;
      uVar16 = ~uVar16 & y0 | y1 & uVar16;
      uVar17 = ~uVar17 & z0 | z1 & uVar17;
      uVar18 = ~uVar18 & c0 | c1 & uVar18;
      iVar10 = (~-(uint)((int)uVar15 < (int)uVar8) & (uVar15 ^ 0xffffffff) + uVar8) +
               (-(uint)((int)uVar20 < 0) & uVar20) +
               (-(uint)(x1 < x0) - (x0 - x1 ^ -(uint)(x1 < x0))) + 1;
      iVar12 = (~-(uint)((int)uVar16 < (int)uVar1) & (uVar16 ^ 0xffffffff) + uVar1) +
               (-(uint)((int)uVar21 < 0) & uVar21) +
               (-(uint)(y1 < y0) - (y0 - y1 ^ -(uint)(y1 < y0))) + 1;
      iVar13 = (~-(uint)((int)uVar17 < (int)uVar2) & (uVar17 ^ 0xffffffff) + uVar2) +
               (-(uint)((int)uVar22 < 0) & uVar22) +
               (-(uint)(z1 < z0) - (z0 - z1 ^ -(uint)(z1 < z0))) + 1;
      uVar14 = (~-(uint)((int)uVar18 < (int)uVar14) & (uVar18 ^ 0xffffffff) + uVar14) +
               (-(uint)((int)uVar23 < 0) & uVar23) +
               (-(uint)(c1 < c0) - (c0 - c1 ^ -(uint)(c1 < c0))) + 1;
      auVar19._0_4_ = -(uint)(iVar10 < 1);
      auVar19._4_4_ = -(uint)(iVar12 < 1);
      auVar19._8_4_ = -(uint)(iVar13 < 1);
      auVar19._12_4_ = -(uint)((int)uVar14 < 1);
      iVar4 = movmskps(z0,auVar19);
      if (iVar4 == 0) {
        uVar6 = (ulong)uVar8;
        lVar5 = uVar1 * uVar6;
        uVar8 = 0;
        if ((int)uVar20 < 1) {
          uVar20 = uVar8;
        }
        if ((int)uVar21 < 1) {
          uVar21 = uVar8;
        }
        if ((int)uVar22 < 1) {
          uVar22 = uVar8;
        }
        if ((int)uVar23 < 1) {
          uVar23 = uVar8;
        }
        __s = this->_data +
              (ulong)uVar2 * lVar5 * (ulong)uVar23 + (ulong)uVar22 * lVar5 +
              uVar21 * uVar6 + (ulong)uVar20;
        do {
          iVar4 = 0;
          do {
            iVar9 = 0;
            do {
              iVar3 = iVar10;
              if (1.0 <= opacity) {
                memset(__s,(uint)val,(long)iVar10);
                __s = __s + this->_width;
              }
              else {
                do {
                  *__s = (byte)(int)((float)*__s *
                                     (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity)) +
                                    (float)val * ABS(opacity));
                  __s = __s + 1;
                  iVar3 = iVar3 + -1;
                } while (iVar3 != 0);
                __s = __s + (uVar6 - (long)iVar10);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != iVar12);
            __s = __s + (uVar1 - iVar12) * uVar6;
            iVar4 = iVar4 + 1;
          } while (iVar4 != iVar13);
          __s = __s + (ulong)(uVar2 - iVar13) * lVar5;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar14);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        offY = (unsigned long)_width*(_height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }